

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmaincn.h
# Opt level: O3

void __thiscall
CVmMainClientConsole::display_error
          (CVmMainClientConsole *this,vm_globals *vmg,CVmException *exc,char *msg,int add_blank_line
          )

{
  CVmConsoleMain *this_00;
  int f;
  size_t sVar1;
  bool bVar2;
  
  sVar1 = strlen(msg);
  this_00 = G_console_X;
  if (sVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = msg[sVar1 - 1] == '\n';
  }
  if (G_console_X != (CVmConsoleMain *)0x0) {
    CVmConsole::flush(&G_console_X->super_CVmConsole,VM_NL_NONE);
    f = CVmConsole::set_obey_whitespace(&this_00->super_CVmConsole,1);
    sVar1 = strlen(msg);
    (*(this_00->super_CVmConsole)._vptr_CVmConsole[1])(this_00,msg,sVar1);
    if (add_blank_line != 0) {
      CVmConsole::write_blank_line(&this_00->super_CVmConsole);
    }
    CVmConsole::set_obey_whitespace(&this_00->super_CVmConsole,f);
    return;
  }
  os_printz(msg);
  if (add_blank_line != 0) {
    os_printz("\n");
    if (!bVar2) {
      os_printz("\n");
      return;
    }
  }
  return;
}

Assistant:

void display_error(struct vm_globals *vmg, const struct CVmException *exc,
                       const char *msg, int add_blank_line)
    {
        CVmConsole *con;
        size_t len;

        /* check for a newline at the end of the message */
        int has_nl = ((len = strlen(msg)) != 0 && msg[len-1] == '\n');
        
        /* set up for global access */
        VMGLOB_PTR(vmg);

        /* if we have globals, get the console */
        con = VMGLOB_IF_AVAIL(G_console);
            
        /* if we have a console, write to it */
        if (con != 0)
        {
            int old_obey;
            
            /* flush any pending buffered output */
            con->flush(vmg_ VM_NL_NONE);

            /* put the console in obey-whitespace mode for our message */
            old_obey = con->set_obey_whitespace(TRUE);

            /* display the message on the console */
            con->format_text(vmg_ msg);

            /* add a blank line if desired */
            if (add_blank_line)
                con->write_blank_line(vmg0_);

            /* restore console mode */
            con->set_obey_whitespace(old_obey);
        }
        else
        {
            /* display the error on the OS-level console */
            os_printz(msg);

            /* add a blank line if desired */
            if (add_blank_line)
            {
                /* add one newline */
                os_printz("\n");

                /* 
                 *   if the message itself didn't end with a newline, add
                 *   another newline 
                 */
                if (!has_nl)
                    os_printz("\n");
            }
        }
    }